

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_Model_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00791d60 == '\x01') {
    DAT_00791d60 = '\0';
    (*(code *)*_Pipeline_default_instance_)();
  }
  if (DAT_00791d88 == '\x01') {
    DAT_00791d88 = '\0';
    (*(code *)*_PipelineClassifier_default_instance_)();
  }
  if (DAT_00791db0 == '\x01') {
    DAT_00791db0 = '\0';
    (*(code *)*_PipelineRegressor_default_instance_)();
  }
  if (DAT_00791de8 == '\x01') {
    DAT_00791de8 = '\0';
    (*(code *)*_FeatureDescription_default_instance_)();
  }
  if (DAT_00791e80 == '\x01') {
    DAT_00791e80 = '\0';
    (*(code *)*_Metadata_default_instance_)();
  }
  if (DAT_00791f00 == '\x01') {
    DAT_00791f00 = '\0';
    (*(code *)*_ModelDescription_default_instance_)();
  }
  if (DAT_00791f30 == '\x01') {
    DAT_00791f30 = '\0';
    (*(code *)*_SerializedModel_default_instance_)();
  }
  if (DAT_00791f68 == '\x01') {
    DAT_00791f68 = 0;
    (*(code *)*_Model_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Pipeline_default_instance_.Shutdown();
  _PipelineClassifier_default_instance_.Shutdown();
  _PipelineRegressor_default_instance_.Shutdown();
  _FeatureDescription_default_instance_.Shutdown();
  _Metadata_default_instance_.Shutdown();
  _ModelDescription_default_instance_.Shutdown();
  _SerializedModel_default_instance_.Shutdown();
  _Model_default_instance_.Shutdown();
}